

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outer_join_marker.cpp
# Opt level: O2

void __thiscall duckdb::OuterJoinMarker::Initialize(OuterJoinMarker *this,idx_t count_p)

{
  pointer __p;
  pointer __p_00;
  __uniq_ptr_impl<bool,_std::default_delete<bool[]>_> local_18;
  
  if (this->enabled == true) {
    this->count = count_p;
    __p_00 = (pointer)operator_new__(count_p);
    local_18._M_t.super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
    super__Head_base<0UL,_bool_*,_false>._M_head_impl =
         (tuple<bool_*,_std::default_delete<bool[]>_>)
         (_Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>)0x0;
    ::std::__uniq_ptr_impl<bool,_std::default_delete<bool[]>_>::reset
              ((__uniq_ptr_impl<bool,_std::default_delete<bool[]>_> *)&this->found_match,__p_00);
    ::std::unique_ptr<bool[],_std::default_delete<bool[]>_>::~unique_ptr
              ((unique_ptr<bool[],_std::default_delete<bool[]>_> *)&local_18);
    if (this->enabled == true) {
      switchD_004a0b15::default
                ((this->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
                 super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                 super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                 super__Head_base<0UL,_bool_*,_false>._M_head_impl,0,this->count);
    }
  }
  return;
}

Assistant:

void OuterJoinMarker::Initialize(idx_t count_p) {
	if (!enabled) {
		return;
	}
	this->count = count_p;
	found_match = make_unsafe_uniq_array_uninitialized<bool>(count);
	Reset();
}